

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O1

ssize_t __thiscall BloomFilter::write(BloomFilter *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  int j;
  undefined8 in_RAX;
  long lVar2;
  byte bVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  bool bVar5;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::ostream::seekp((long)CONCAT44(in_register_00000034,__fd),0x20);
  uVar4 = 0;
  do {
    lVar2 = 0;
    bVar3 = 0;
    do {
      bVar3 = bVar3 | (((this->bits).super__Base_bitset<1280UL>._M_w[uVar4 + lVar2 >> 6] >>
                        ((ulong)(((uint)uVar4 & 0x3f) + (int)lVar2) & 0x3f) & 1) != 0) <<
                      ((byte)lVar2 & 0x1f);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    uStack_28 = CONCAT17(bVar3,(int7)uStack_28);
    std::ostream::write((char *)CONCAT44(in_register_00000034,__fd),(long)&uStack_28 + 7);
    uVar1 = uVar4 + 8;
    bVar5 = uVar4 < 0x13ff8;
    uVar4 = uVar1;
  } while (bVar5);
  return uVar1;
}

Assistant:

void BloomFilter::write(ofstream &out) {
  out.seekp(32, std::ofstream::beg);
  for (int i = 0; i < 10240 * 8; i += 8) {
    char temp = false;
    for (int j = 0; j <= 7; j++)
      temp |=
          bits[i + j] << j;  // NOLINT(cppcoreguidelines-narrowing-conversions)
    out.write(&temp, sizeof(temp));
  }
}